

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

bool EvalChecksig(valtype *sig,valtype *pubkey,const_iterator pbegincodehash,const_iterator pend,
                 ScriptExecutionData *execdata,uint flags,BaseSignatureChecker *checker,
                 SigVersion sigversion,ScriptError *serror,bool *success)

{
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  long lVar4;
  pointer pbVar5;
  pointer puVar6;
  pointer puVar7;
  bool bVar8;
  int iVar9;
  ScriptError SVar10;
  CScript *b;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b_00;
  SigVersion local_7c;
  undefined1 local_78 [28];
  uint uStack_5c;
  CScript scriptCode;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (WITNESS_V0 < sigversion) {
    if (sigversion != TAPSCRIPT) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                    ,0x193,
                    "bool EvalChecksig(const valtype &, const valtype &, CScript::const_iterator, CScript::const_iterator, ScriptExecutionData &, unsigned int, const BaseSignatureChecker &, SigVersion, ScriptError *, bool &)"
                   );
    }
    puVar2 = (sig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (sig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    *success = puVar2 != puVar3;
    if (puVar2 == puVar3) {
LAB_001ef3fc:
      puVar6 = (pubkey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar7 = (pubkey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if ((long)puVar7 - (long)puVar6 == 0x20) {
        if ((puVar2 == puVar3) ||
           (iVar9 = (*checker->_vptr_BaseSignatureChecker[1])
                              (checker,puVar2,(long)puVar3 - (long)puVar2,puVar6,0x20,3,execdata,
                               serror), (char)iVar9 != '\0')) {
LAB_001ef447:
          bVar8 = true;
          goto LAB_001ef459;
        }
      }
      else if (puVar7 == puVar6) {
        if (serror != (ScriptError *)0x0) {
          *serror = SCRIPT_ERR_PUBKEYTYPE;
        }
      }
      else {
        if ((flags >> 0x14 & 1) == 0) goto LAB_001ef447;
        if (serror != (ScriptError *)0x0) {
          *serror = SCRIPT_ERR_DISCOURAGE_UPGRADABLE_PUBKEYTYPE;
        }
      }
    }
    else {
      if (execdata->m_validation_weight_left_init == false) {
        __assert_fail("execdata.m_validation_weight_left_init",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                      ,0x168,
                      "bool EvalChecksigTapscript(const valtype &, const valtype &, ScriptExecutionData &, unsigned int, const BaseSignatureChecker &, SigVersion, ScriptError *, bool &)"
                     );
      }
      lVar4 = execdata->m_validation_weight_left;
      execdata->m_validation_weight_left = lVar4 + -0x32;
      if (0x31 < lVar4) goto LAB_001ef3fc;
      if (serror != (ScriptError *)0x0) {
        *serror = SCRIPT_ERR_TAPSCRIPT_VALIDATION_WEIGHT;
      }
    }
    bVar8 = false;
    goto LAB_001ef459;
  }
  local_7c = sigversion;
  if (WITNESS_V0 < sigversion) {
    __assert_fail("sigversion == SigVersion::BASE || sigversion == SigVersion::WITNESS_V0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                  ,0x142,
                  "bool EvalChecksigPreTapscript(const valtype &, const valtype &, CScript::const_iterator, CScript::const_iterator, unsigned int, const BaseSignatureChecker &, SigVersion, ScriptError *, bool &)"
                 );
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  prevector<prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator>
            (&scriptCode.super_CScriptBase,pbegincodehash,pend);
  if (sigversion == BASE) {
    local_78._16_8_ = 0;
    stack0xffffffffffffffa0 = 0;
    local_78._0_8_ = (char *)0x0;
    local_78._8_8_ = 0;
    pbVar5 = (sig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    b_00._M_extent._M_extent_value =
         (long)(sig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)pbVar5;
    b_00._M_ptr = pbVar5;
    b = CScript::operator<<((CScript *)local_78,b_00);
    iVar9 = FindAndDelete(&scriptCode,b);
    if (0x1c < uStack_5c) {
      free((void *)local_78._0_8_);
      local_78._0_8_ = (char *)0x0;
    }
    if (((flags >> 0x10 & 1) == 0) || (iVar9 < 1)) goto LAB_001ef29e;
    SVar10 = SCRIPT_ERR_SIG_FINDANDDELETE;
LAB_001ef3d7:
    if (serror != (ScriptError *)0x0) {
      *serror = SVar10;
    }
LAB_001ef3de:
    bVar8 = false;
  }
  else {
LAB_001ef29e:
    bVar8 = CheckSignatureEncoding(sig,flags,serror);
    if ((!bVar8) || (bVar8 = CheckPubKeyEncoding(pubkey,flags,&local_7c,serror), !bVar8))
    goto LAB_001ef3de;
    iVar9 = (**checker->_vptr_BaseSignatureChecker)
                      (checker,sig,pubkey,&scriptCode,(ulong)sigversion);
    *success = SUB41(iVar9,0);
    bVar8 = true;
    if (((flags >> 0xe & 1) != 0 && SUB41(iVar9,0) == false) &&
       ((sig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish !=
        (sig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start)) {
      SVar10 = SCRIPT_ERR_SIG_NULLFAIL;
      goto LAB_001ef3d7;
    }
  }
  if (0x1c < scriptCode.super_CScriptBase._size) {
    free(scriptCode.super_CScriptBase._union.indirect_contents.indirect);
    scriptCode.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
LAB_001ef459:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

static bool EvalChecksig(const valtype& sig, const valtype& pubkey, CScript::const_iterator pbegincodehash, CScript::const_iterator pend, ScriptExecutionData& execdata, unsigned int flags, const BaseSignatureChecker& checker, SigVersion sigversion, ScriptError* serror, bool& success)
{
    switch (sigversion) {
    case SigVersion::BASE:
    case SigVersion::WITNESS_V0:
        return EvalChecksigPreTapscript(sig, pubkey, pbegincodehash, pend, flags, checker, sigversion, serror, success);
    case SigVersion::TAPSCRIPT:
        return EvalChecksigTapscript(sig, pubkey, execdata, flags, checker, sigversion, serror, success);
    case SigVersion::TAPROOT:
        // Key path spending in Taproot has no script, so this is unreachable.
        break;
    }
    assert(false);
}